

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool ImGui_SetStyle(void)

{
  ImGuiStyle *style;
  ImVec4 local_258;
  ImVec4 local_248;
  ImVec4 local_238;
  ImVec4 local_228;
  ImVec4 local_218;
  ImVec4 local_208;
  ImVec4 local_1f8;
  ImVec4 local_1e8;
  ImVec4 local_1d8;
  ImVec4 local_1c8;
  ImVec4 local_1b8;
  ImVec4 local_1a8;
  ImVec4 local_198;
  ImVec4 local_188;
  ImVec4 local_178;
  ImVec4 local_168;
  ImVec4 local_158;
  ImVec4 local_148;
  ImVec4 local_138;
  ImVec4 local_128;
  ImVec4 local_118;
  ImVec4 local_108;
  ImVec4 local_f8;
  ImVec4 local_e8;
  ImVec4 local_d8;
  ImVec4 local_c8;
  ImVec4 local_b8;
  ImVec4 local_a8;
  ImVec4 local_98;
  ImVec4 local_88;
  ImVec4 local_78;
  ImVec4 local_68;
  ImVec4 local_58;
  ImVec4 local_48;
  ImVec4 local_38;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImVec2 local_10;
  long local_8;
  
  local_8 = ImGui::GetStyle();
  *(undefined1 *)(local_8 + 0xb2) = 1;
  *(undefined1 *)(local_8 + 0xb0) = 1;
  *(undefined4 *)(local_8 + 0xc) = 0;
  ImVec2::ImVec2(&local_10,8.0,8.0);
  *(ImVec2 *)(local_8 + 4) = local_10;
  *(undefined4 *)(local_8 + 0xc) = 0;
  ImVec2::ImVec2(&local_18,4.0,3.0);
  *(ImVec2 *)(local_8 + 0x38) = local_18;
  *(undefined4 *)(local_8 + 0x40) = 0;
  ImVec2::ImVec2(&local_20,8.0,4.0);
  *(ImVec2 *)(local_8 + 0x48) = local_20;
  ImVec2::ImVec2(&local_28,4.0,4.0);
  *(ImVec2 *)(local_8 + 0x50) = local_28;
  *(undefined4 *)(local_8 + 0x60) = 0x41a80000;
  *(undefined4 *)(local_8 + 0x68) = 0x41800000;
  *(undefined4 *)(local_8 + 0x6c) = 0x41100000;
  *(undefined4 *)(local_8 + 0x70) = 0x41200000;
  *(undefined4 *)(local_8 + 0x74) = 0x40400000;
  ImVec4::ImVec4(&local_38,1.0,1.0,1.0,1.0);
  *(undefined8 *)(local_8 + 0xbc) = local_38._0_8_;
  *(undefined8 *)(local_8 + 0xc4) = local_38._8_8_;
  ImVec4::ImVec4(&local_48,0.24,0.41,0.41,1.0);
  *(undefined8 *)(local_8 + 0xcc) = local_48._0_8_;
  *(undefined8 *)(local_8 + 0xd4) = local_48._8_8_;
  ImVec4::ImVec4(&local_58,0.08,0.08,0.08,0.94);
  *(undefined8 *)(local_8 + 0xdc) = local_58._0_8_;
  *(undefined8 *)(local_8 + 0xe4) = local_58._8_8_;
  ImVec4::ImVec4(&local_68,0.07,0.07,0.09,1.0);
  *(undefined8 *)(local_8 + 0xfc) = local_68._0_8_;
  *(undefined8 *)(local_8 + 0x104) = local_68._8_8_;
  ImVec4::ImVec4(&local_78,0.31,0.31,0.31,0.71);
  *(undefined8 *)(local_8 + 0x10c) = local_78._0_8_;
  *(undefined8 *)(local_8 + 0x114) = local_78._8_8_;
  ImVec4::ImVec4(&local_88,0.0,0.0,0.0,0.0);
  *(undefined8 *)(local_8 + 0x11c) = local_88._0_8_;
  *(undefined8 *)(local_8 + 0x124) = local_88._8_8_;
  ImVec4::ImVec4(&local_98,0.0,0.39,0.39,0.39);
  *(undefined8 *)(local_8 + 300) = local_98._0_8_;
  *(undefined8 *)(local_8 + 0x134) = local_98._8_8_;
  ImVec4::ImVec4(&local_a8,0.26,1.0,1.0,0.39);
  *(undefined8 *)(local_8 + 0x13c) = local_a8._0_8_;
  *(undefined8 *)(local_8 + 0x144) = local_a8._8_8_;
  ImVec4::ImVec4(&local_b8,0.0,0.78,0.0,1.0);
  *(undefined8 *)(local_8 + 0x14c) = local_b8._0_8_;
  *(undefined8 *)(local_8 + 0x154) = local_b8._8_8_;
  ImVec4::ImVec4(&local_c8,0.0,0.5,0.5,0.7);
  *(undefined8 *)(local_8 + 0x15c) = local_c8._0_8_;
  *(undefined8 *)(local_8 + 0x164) = local_c8._8_8_;
  ImVec4::ImVec4(&local_d8,0.0,0.5,0.5,1.0);
  *(undefined8 *)(local_8 + 0x17c) = local_d8._0_8_;
  *(undefined8 *)(local_8 + 0x184) = local_d8._8_8_;
  ImVec4::ImVec4(&local_e8,0.0,0.7,0.7,1.0);
  *(undefined8 *)(local_8 + 0x16c) = local_e8._0_8_;
  *(undefined8 *)(local_8 + 0x174) = local_e8._8_8_;
  ImVec4::ImVec4(&local_f8,0.0,0.7,0.7,1.0);
  *(undefined8 *)(local_8 + 0x18c) = local_f8._0_8_;
  *(undefined8 *)(local_8 + 0x194) = local_f8._8_8_;
  ImVec4::ImVec4(&local_108,0.1,0.27,0.27,1.0);
  *(undefined8 *)(local_8 + 0x19c) = local_108._0_8_;
  *(undefined8 *)(local_8 + 0x1a4) = local_108._8_8_;
  ImVec4::ImVec4(&local_118,0.8,0.8,0.83,0.31);
  *(undefined8 *)(local_8 + 0x1ac) = local_118._0_8_;
  *(undefined8 *)(local_8 + 0x1b4) = local_118._8_8_;
  ImVec4::ImVec4(&local_128,0.26,1.0,1.0,0.39);
  *(undefined8 *)(local_8 + 0x1bc) = local_128._0_8_;
  *(undefined8 *)(local_8 + 0x1c4) = local_128._8_8_;
  ImVec4::ImVec4(&local_138,0.0,0.78,0.0,1.0);
  *(undefined8 *)(local_8 + 0x1cc) = local_138._0_8_;
  *(undefined8 *)(local_8 + 0x1d4) = local_138._8_8_;
  ImVec4::ImVec4(&local_148,0.8,0.8,0.83,0.39);
  *(undefined8 *)(local_8 + 0x1dc) = local_148._0_8_;
  *(undefined8 *)(local_8 + 0x1e4) = local_148._8_8_;
  ImVec4::ImVec4(&local_158,0.8,0.8,0.83,0.39);
  *(undefined8 *)(local_8 + 0x1ec) = local_158._0_8_;
  *(undefined8 *)(local_8 + 500) = local_158._8_8_;
  ImVec4::ImVec4(&local_168,0.0,0.78,0.0,1.0);
  *(undefined8 *)(local_8 + 0x1fc) = local_168._0_8_;
  *(undefined8 *)(local_8 + 0x204) = local_168._8_8_;
  ImVec4::ImVec4(&local_178,0.13,0.55,0.55,1.0);
  *(undefined8 *)(local_8 + 0x20c) = local_178._0_8_;
  *(undefined8 *)(local_8 + 0x214) = local_178._8_8_;
  ImVec4::ImVec4(&local_188,0.61,1.0,0.0,0.51);
  *(undefined8 *)(local_8 + 0x21c) = local_188._0_8_;
  *(undefined8 *)(local_8 + 0x224) = local_188._8_8_;
  ImVec4::ImVec4(&local_198,0.0,0.78,0.0,1.0);
  *(undefined8 *)(local_8 + 0x22c) = local_198._0_8_;
  *(undefined8 *)(local_8 + 0x234) = local_198._8_8_;
  ImVec4::ImVec4(&local_1a8,0.79,0.51,0.0,0.51);
  *(undefined8 *)(local_8 + 0x23c) = local_1a8._0_8_;
  *(undefined8 *)(local_8 + 0x244) = local_1a8._8_8_;
  ImVec4::ImVec4(&local_1b8,0.79,0.51,0.0,0.67);
  *(undefined8 *)(local_8 + 0x24c) = local_1b8._0_8_;
  *(undefined8 *)(local_8 + 0x254) = local_1b8._8_8_;
  ImVec4::ImVec4(&local_1c8,0.79,0.51,0.0,0.67);
  *(undefined8 *)(local_8 + 0x25c) = local_1c8._0_8_;
  *(undefined8 *)(local_8 + 0x264) = local_1c8._8_8_;
  ImVec4::ImVec4(&local_1d8,0.0,0.0,0.0,0.0);
  *(undefined8 *)(local_8 + 0x29c) = local_1d8._0_8_;
  *(undefined8 *)(local_8 + 0x2a4) = local_1d8._8_8_;
  ImVec4::ImVec4(&local_1e8,0.26,1.0,1.0,0.39);
  *(undefined8 *)(local_8 + 0x2ac) = local_1e8._0_8_;
  *(undefined8 *)(local_8 + 0x2b4) = local_1e8._8_8_;
  ImVec4::ImVec4(&local_1f8,0.0,0.78,0.0,1.0);
  *(undefined8 *)(local_8 + 700) = local_1f8._0_8_;
  *(undefined8 *)(local_8 + 0x2c4) = local_1f8._8_8_;
  ImVec4::ImVec4(&local_208,1.0,0.65,0.38,0.67);
  *(undefined8 *)(local_8 + 0x31c) = local_208._0_8_;
  *(undefined8 *)(local_8 + 0x324) = local_208._8_8_;
  ImVec4::ImVec4(&local_218,0.25,1.0,0.0,1.0);
  *(undefined8 *)(local_8 + 0x32c) = local_218._0_8_;
  *(undefined8 *)(local_8 + 0x334) = local_218._8_8_;
  ImVec4::ImVec4(&local_228,1.0,0.65,0.38,0.67);
  *(undefined8 *)(local_8 + 0x33c) = local_228._0_8_;
  *(undefined8 *)(local_8 + 0x344) = local_228._8_8_;
  ImVec4::ImVec4(&local_238,0.25,1.0,0.0,1.0);
  *(undefined8 *)(local_8 + 0x34c) = local_238._0_8_;
  *(undefined8 *)(local_8 + 0x354) = local_238._8_8_;
  ImVec4::ImVec4(&local_248,0.25,1.0,0.0,0.43);
  *(undefined8 *)(local_8 + 0x35c) = local_248._0_8_;
  *(undefined8 *)(local_8 + 0x364) = local_248._8_8_;
  ImVec4::ImVec4(&local_258,1.0,0.98,0.95,0.78);
  *(undefined8 *)(local_8 + 0x3ac) = local_258._0_8_;
  *(undefined8 *)(local_8 + 0x3b4) = local_258._8_8_;
  return true;
}

Assistant:

bool ImGui_SetStyle() {
    ImGuiStyle & style = ImGui::GetStyle();

    style.AntiAliasedFill = true;
    style.AntiAliasedLines = true;
    style.WindowRounding = 0.0f;

    style.WindowPadding = ImVec2(8, 8);
    style.WindowRounding = 0.0f;
    style.FramePadding = ImVec2(4, 3);
    style.FrameRounding = 0.0f;
    style.ItemSpacing = ImVec2(8, 4);
    style.ItemInnerSpacing = ImVec2(4, 4);
    style.IndentSpacing = 21.0f;
    style.ScrollbarSize = 16.0f;
    style.ScrollbarRounding = 9.0f;
    style.GrabMinSize = 10.0f;
    style.GrabRounding = 3.0f;

    style.Colors[ImGuiCol_Text]                  = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
    style.Colors[ImGuiCol_TextDisabled]          = ImVec4(0.24f, 0.41f, 0.41f, 1.00f);
    style.Colors[ImGuiCol_WindowBg]              = ImVec4(0.08f, 0.08f, 0.08f, 0.94f);
    //style.Colors[ImGuiCol_ChildWindowBg]         = ImVec4(0.07f, 0.07f, 0.09f, 1.00f);
    style.Colors[ImGuiCol_PopupBg]               = ImVec4(0.07f, 0.07f, 0.09f, 1.00f);
    style.Colors[ImGuiCol_Border]                = ImVec4(0.31f, 0.31f, 0.31f, 0.71f);
    style.Colors[ImGuiCol_BorderShadow]          = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    style.Colors[ImGuiCol_FrameBg]               = ImVec4(0.00f, 0.39f, 0.39f, 0.39f);
    style.Colors[ImGuiCol_FrameBgHovered]        = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    style.Colors[ImGuiCol_FrameBgActive]         = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_TitleBg]               = ImVec4(0.00f, 0.50f, 0.50f, 0.70f);
    style.Colors[ImGuiCol_TitleBgCollapsed]      = ImVec4(0.00f, 0.50f, 0.50f, 1.00f);
    style.Colors[ImGuiCol_TitleBgActive]         = ImVec4(0.00f, 0.70f, 0.70f, 1.00f);
    style.Colors[ImGuiCol_MenuBarBg]             = ImVec4(0.00f, 0.70f, 0.70f, 1.00f);
    style.Colors[ImGuiCol_ScrollbarBg]           = ImVec4(0.10f, 0.27f, 0.27f, 1.00f);
    style.Colors[ImGuiCol_ScrollbarGrab]         = ImVec4(0.80f, 0.80f, 0.83f, 0.31f);
    style.Colors[ImGuiCol_ScrollbarGrabHovered]  = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    style.Colors[ImGuiCol_ScrollbarGrabActive]   = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    //style.Colors[ImGuiCol_ComboBg]               = ImVec4(0.00f, 0.39f, 0.39f, 1.00f);
    style.Colors[ImGuiCol_CheckMark]             = ImVec4(0.80f, 0.80f, 0.83f, 0.39f);
    style.Colors[ImGuiCol_SliderGrab]            = ImVec4(0.80f, 0.80f, 0.83f, 0.39f);
    style.Colors[ImGuiCol_SliderGrabActive]      = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_Button]                = ImVec4(0.13f, 0.55f, 0.55f, 1.00f);
    style.Colors[ImGuiCol_ButtonHovered]         = ImVec4(0.61f, 1.00f, 0.00f, 0.51f);
    style.Colors[ImGuiCol_ButtonActive]          = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_Header]                = ImVec4(0.79f, 0.51f, 0.00f, 0.51f);
    style.Colors[ImGuiCol_HeaderHovered]         = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    style.Colors[ImGuiCol_HeaderActive]          = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    //style.Colors[ImGuiCol_Column]                = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    //style.Colors[ImGuiCol_ColumnHovered]         = ImVec4(0.25f, 1.00f, 0.00f, 1.00f);
    //style.Colors[ImGuiCol_ColumnActive]          = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    style.Colors[ImGuiCol_ResizeGrip]            = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    style.Colors[ImGuiCol_ResizeGripHovered]     = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    style.Colors[ImGuiCol_ResizeGripActive]      = ImVec4(0.00f, 0.78f, 0.00f, 1.00f);
    //style.Colors[ImGuiCol_CloseButton]           = ImVec4(0.40f, 0.39f, 0.38f, 0.16f);
    //style.Colors[ImGuiCol_CloseButtonHovered]    = ImVec4(0.26f, 1.00f, 1.00f, 0.39f);
    //style.Colors[ImGuiCol_CloseButtonActive]     = ImVec4(0.79f, 0.51f, 0.00f, 0.67f);
    style.Colors[ImGuiCol_PlotLines]             = ImVec4(1.00f, 0.65f, 0.38f, 0.67f);
    style.Colors[ImGuiCol_PlotLinesHovered]      = ImVec4(0.25f, 1.00f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_PlotHistogram]         = ImVec4(1.00f, 0.65f, 0.38f, 0.67f);
    style.Colors[ImGuiCol_PlotHistogramHovered]  = ImVec4(0.25f, 1.00f, 0.00f, 1.00f);
    style.Colors[ImGuiCol_TextSelectedBg]        = ImVec4(0.25f, 1.00f, 0.00f, 0.43f);
    style.Colors[ImGuiCol_ModalWindowDarkening]  = ImVec4(1.00f, 0.98f, 0.95f, 0.78f);

    return true;
}